

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathUtils.h
# Opt level: O0

optional<unsigned_int> slang::checkedMulU32(uint32_t a,uint32_t b)

{
  uint in_ESI;
  uint in_EDI;
  uint32_t result;
  undefined4 in_stack_ffffffffffffffe8;
  _Optional_payload_base<unsigned_int> local_8;
  
  if ((int)((ulong)in_EDI * (ulong)in_ESI >> 0x20) == 0) {
    local_8 = (_Optional_payload_base<unsigned_int>)
              std::make_optional<unsigned_int&>
                        ((uint *)CONCAT44((int)((ulong)in_EDI * (ulong)in_ESI),
                                          in_stack_ffffffffffffffe8));
  }
  else {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_8);
  }
  return (optional<unsigned_int>)local_8;
}

Assistant:

inline std::optional<uint32_t> checkedMulU32(uint32_t a, uint32_t b) {
#if defined(_MSC_VER)
    uint64_t p = uint64_t(a) * uint64_t(b);
    return p <= std::numeric_limits<uint32_t>::max() ? std::make_optional(uint32_t(p))
                                                     : std::nullopt;
#else
    uint32_t result;
    return __builtin_mul_overflow(a, b, &result) ? std::nullopt : std::make_optional(result);
#endif
}